

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

void libtorrent::initialize_default_settings(session_settings_single_thread *s)

{
  int name;
  session_settings_single_thread *psVar1;
  ulong uVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  uint local_4c;
  uint local_48;
  int i_2;
  int i_1;
  string local_38;
  int local_14;
  session_settings_single_thread *psStack_10;
  int i;
  session_settings_single_thread *s_local;
  
  psStack_10 = s;
  for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
    aux::
    container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
    ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                  *)(anonymous_namespace)::str_settings,(long)local_14);
    uVar2 = ::std::__cxx11::string::empty();
    psVar1 = psStack_10;
    name = local_14;
    if ((uVar2 & 1) == 0) {
      pvVar3 = aux::
               container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
               ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                             *)(anonymous_namespace)::str_settings,(long)local_14);
      ::std::__cxx11::string::string((string *)&local_38,(string *)&pvVar3->default_value);
      aux::session_settings_single_thread::set_str(psVar1,name,&local_38);
      ::std::__cxx11::string::~string((string *)&local_38);
    }
  }
  for (local_48 = 0; psVar1 = psStack_10, (int)local_48 < 0x9f; local_48 = local_48 + 1) {
    pvVar4 = aux::
             container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
             ::operator[]((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                           *)(anonymous_namespace)::int_settings,(long)(int)local_48);
    aux::session_settings_single_thread::set_int(psVar1,local_48 | 0x4000,pvVar4->default_value);
  }
  for (local_4c = 0; psVar1 = psStack_10, (int)local_4c < 0x54; local_4c = local_4c + 1) {
    pvVar5 = aux::
             container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
             ::operator[]((container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                           *)(anonymous_namespace)::bool_settings,(long)(int)local_4c);
    aux::session_settings_single_thread::set_bool
              (psVar1,local_4c | 0x8000,(bool)(pvVar5->default_value & 1));
  }
  return;
}

Assistant:

void initialize_default_settings(aux::session_settings_single_thread& s)
	{
		for (int i = 0; i < settings_pack::num_string_settings; ++i)
		{
			if (str_settings[i].default_value.empty()) continue;
			s.set_str(settings_pack::string_type_base | i, str_settings[i].default_value);
			TORRENT_ASSERT(s.get_str(settings_pack::string_type_base + i) == str_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_int_settings; ++i)
		{
			s.set_int(settings_pack::int_type_base | i, int_settings[i].default_value);
			TORRENT_ASSERT(s.get_int(settings_pack::int_type_base + i) == int_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_bool_settings; ++i)
		{
			s.set_bool(settings_pack::bool_type_base | i, bool_settings[i].default_value);
			TORRENT_ASSERT(s.get_bool(settings_pack::bool_type_base + i) == bool_settings[i].default_value);
		}
	}